

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestcompareString::runTestCase(TestValueTestcompareString *this)

{
  TestResult *pTVar1;
  ValueTest *in_RDI;
  PredicateContext _minitest_Context_7;
  PredicateContext _minitest_Context_6;
  PredicateContext _minitest_Context_5;
  PredicateContext _minitest_Context_4;
  PredicateContext _minitest_Context_3;
  PredicateContext _minitest_Context_2;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  Value *in_stack_fffffffffffffbd0;
  Value *y;
  Value *in_stack_fffffffffffffbd8;
  char *x;
  Value *in_stack_fffffffffffffc00;
  PredicateContext local_3c8 [2];
  PredicateContext local_348 [2];
  PredicateContext local_2c8 [2];
  PredicateContext local_248 [2];
  PredicateContext local_1c8 [2];
  PredicateContext local_148 [2];
  PredicateContext local_c8 [3];
  PredicateContext local_38;
  
  local_38.id_ = *(Id *)((ValueHolder *)&in_RDI->super_TestCase)[1].string_;
  local_38.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_38.line_ = 0x538;
  local_38.expr_ = "checkIsLess(\"\", \" \")";
  local_38.next_ = (PredicateContext *)0x0;
  local_38.failure_ = (Failure *)0x0;
  *(PredicateContext **)
   (*(long *)((long)((ValueHolder *)&in_RDI->super_TestCase)[1].map_ + 8) + 0x20) = &local_38;
  *(int *)((ValueHolder *)&in_RDI->super_TestCase)[1].string_ =
       *(int *)((ValueHolder *)&in_RDI->super_TestCase)[1].string_ + 1;
  *(PredicateContext **)((long)((ValueHolder *)&in_RDI->super_TestCase)[1].map_ + 8) = &local_38;
  Json::Value::Value((Value *)in_RDI,(char *)in_stack_fffffffffffffbd8);
  Json::Value::Value((Value *)in_RDI,(char *)in_stack_fffffffffffffbd8);
  ValueTest::checkIsLess(in_RDI,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_c8[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_c8[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_c8[0].line_ = 0x539;
  local_c8[0].expr_ = "checkIsLess(\"\", \"a\")";
  local_c8[0].next_ = (PredicateContext *)0x0;
  local_c8[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_c8;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_c8;
  Json::Value::Value((Value *)in_RDI,(char *)in_stack_fffffffffffffbd8);
  Json::Value::Value((Value *)in_RDI,(char *)in_stack_fffffffffffffbd8);
  ValueTest::checkIsLess(in_RDI,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_148[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_148[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_148[0].line_ = 0x53a;
  local_148[0].expr_ = "checkIsLess(\"abcd\", \"zyui\")";
  local_148[0].next_ = (PredicateContext *)0x0;
  local_148[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_148;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_148;
  Json::Value::Value((Value *)in_RDI,(char *)in_stack_fffffffffffffbd8);
  Json::Value::Value((Value *)in_RDI,(char *)in_stack_fffffffffffffbd8);
  ValueTest::checkIsLess(in_RDI,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_1c8[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_1c8[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1c8[0].line_ = 0x53b;
  local_1c8[0].expr_ = "checkIsLess(\"abc\", \"abcd\")";
  local_1c8[0].next_ = (PredicateContext *)0x0;
  local_1c8[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_1c8;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_1c8;
  Json::Value::Value((Value *)in_RDI,(char *)in_stack_fffffffffffffbd8);
  Json::Value::Value((Value *)in_RDI,(char *)in_stack_fffffffffffffbd8);
  ValueTest::checkIsLess(in_RDI,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_248[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_248[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_248[0].line_ = 0x53c;
  local_248[0].expr_ = "checkIsEqual(\"abcd\", \"abcd\")";
  local_248[0].next_ = (PredicateContext *)0x0;
  local_248[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_248;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_248;
  x = "abcd";
  Json::Value::Value((Value *)in_RDI,"abcd");
  Json::Value::Value((Value *)in_RDI,x);
  ValueTest::checkIsEqual(in_RDI,(Value *)x,in_stack_fffffffffffffbd0);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_2c8[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_2c8[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2c8[0].line_ = 0x53d;
  local_2c8[0].expr_ = "checkIsEqual(\" \", \" \")";
  local_2c8[0].next_ = (PredicateContext *)0x0;
  local_2c8[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_2c8;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_2c8;
  y = (Value *)0x195032;
  Json::Value::Value((Value *)in_RDI,x);
  Json::Value::Value((Value *)in_RDI,x);
  ValueTest::checkIsEqual(in_RDI,(Value *)x,y);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_348[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_348[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_348[0].line_ = 0x53e;
  local_348[0].expr_ = "checkIsLess(\"ABCD\", \"abcd\")";
  local_348[0].next_ = (PredicateContext *)0x0;
  local_348[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_348;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_348;
  Json::Value::Value((Value *)in_RDI,x);
  Json::Value::Value((Value *)in_RDI,x);
  ValueTest::checkIsLess(in_RDI,(Value *)x,y);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  local_3c8[0].id_ = ((in_RDI->super_TestCase).result_)->predicateId_;
  local_3c8[0].file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_3c8[0].line_ = 0x53f;
  local_3c8[0].expr_ = "checkIsEqual(\"ABCD\", \"ABCD\")";
  local_3c8[0].next_ = (PredicateContext *)0x0;
  local_3c8[0].failure_ = (Failure *)0x0;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_->next_ = local_3c8;
  pTVar1 = (in_RDI->super_TestCase).result_;
  pTVar1->predicateId_ = pTVar1->predicateId_ + 1;
  ((in_RDI->super_TestCase).result_)->predicateStackTail_ = local_3c8;
  Json::Value::Value((Value *)in_RDI,x);
  Json::Value::Value((Value *)in_RDI,x);
  ValueTest::checkIsEqual(in_RDI,(Value *)x,y);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  Json::Value::~Value(in_stack_fffffffffffffc00);
  JsonTest::TestResult::popPredicateContext((in_RDI->super_TestCase).result_);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareString) {
  JSONTEST_ASSERT_PRED(checkIsLess("", " "));
  JSONTEST_ASSERT_PRED(checkIsLess("", "a"));
  JSONTEST_ASSERT_PRED(checkIsLess("abcd", "zyui"));
  JSONTEST_ASSERT_PRED(checkIsLess("abc", "abcd"));
  JSONTEST_ASSERT_PRED(checkIsEqual("abcd", "abcd"));
  JSONTEST_ASSERT_PRED(checkIsEqual(" ", " "));
  JSONTEST_ASSERT_PRED(checkIsLess("ABCD", "abcd"));
  JSONTEST_ASSERT_PRED(checkIsEqual("ABCD", "ABCD"));
}